

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Fp fp)

{
  Syntax SVar1;
  char *pcVar2;
  StrWriter *this_local;
  Fp fp_local;
  
  SVar1 = this->style->syntax;
  if (SVar1 == MOIRA_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '%';
LAB_00138159:
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'F';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'P';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = (char)fp.raw + '0';
  }
  else {
    if (SVar1 != GNU) {
      if (SVar1 != GNU_MIT) goto LAB_00138159;
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '%';
    }
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'f';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'p';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = (char)fp.raw + '0';
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Fp fp)
{
    switch (style.syntax) {

        case Syntax::GNU_MIT:      *ptr++ = '%'; [[fallthrough]];
       case Syntax::GNU:          *ptr++ = 'f'; *ptr++ = 'p'; *ptr++ = '0' + (char)fp.raw; break;
        case Syntax::MOIRA_MIT:    *ptr++ = '%'; [[fallthrough]];
        
        default:
            *ptr++ = 'F'; *ptr++ = 'P'; *ptr++ = '0' + (char)fp.raw; break;
    }

    return *this;
}